

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O1

void TestDoubleToShortest(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  StringBuilder builder;
  char buffer [128];
  StringBuilder local_250;
  DoubleToStringConverter local_238;
  DoubleToStringConverter local_208;
  DoubleToStringConverter local_1d8;
  DoubleToStringConverter local_1a8;
  DoubleToStringConverter local_178;
  DoubleToStringConverter local_148;
  DoubleToStringConverter local_118;
  DoubleToStringConverter local_e8;
  DoubleToStringConverter local_b8;
  char local_88 [128];
  
  local_250.buffer_.start_ = local_88;
  local_250.buffer_.length_ = 0x80;
  local_250.position_ = 0;
  local_238.flags_ = 9;
  local_238.infinity_symbol_ = (char *)0x0;
  local_238.nan_symbol_ = (char *)0x0;
  local_238.exponent_character_ = 'e';
  local_238.decimal_in_shortest_low_ = -6;
  local_238.decimal_in_shortest_high_ = 0x15;
  local_238.max_leading_padding_zeroes_in_precision_mode_ = 0;
  local_238.max_trailing_padding_zeroes_in_precision_mode_ = 0;
  local_238.min_exponent_width_ = 0;
  bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                    (&local_238,0.0,&local_250,SHORTEST);
  pcVar3 = local_250.buffer_.start_;
  if (bVar1) {
    local_250.buffer_.start_[local_250.position_] = '\0';
    local_250.position_ = -1;
    if (local_250.buffer_.start_ == (char *)0x0) {
LAB_0082bbc3:
      local_250.position_ = -1;
      abort();
    }
    iVar2 = strcmp("0",local_250.buffer_.start_);
    if (iVar2 != 0) {
      pcVar4 = "\"0\"";
      pcVar6 = "0";
      uVar5 = 0x31;
LAB_0082cb90:
      printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
             ,uVar5,pcVar4,"builder.Finalize()",pcVar6,pcVar3);
      abort();
    }
    local_250.position_ = 0;
    bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                      (&local_238,12345.0,&local_250,SHORTEST);
    pcVar3 = local_250.buffer_.start_;
    if (bVar1) {
      local_250.buffer_.start_[local_250.position_] = '\0';
      local_250.position_ = -1;
      if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
      iVar2 = strcmp("12345",local_250.buffer_.start_);
      if (iVar2 != 0) {
        pcVar4 = "\"12345\"";
        pcVar6 = "12345";
        uVar5 = 0x35;
        goto LAB_0082cb90;
      }
      local_250.position_ = 0;
      bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                        (&local_238,1.2345e+27,&local_250,SHORTEST);
      pcVar3 = local_250.buffer_.start_;
      if (bVar1) {
        local_250.buffer_.start_[local_250.position_] = '\0';
        local_250.position_ = -1;
        if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
        iVar2 = strcmp("1.2345e+27",local_250.buffer_.start_);
        if (iVar2 != 0) {
          pcVar4 = "\"1.2345e+27\"";
          pcVar6 = "1.2345e+27";
          uVar5 = 0x39;
          goto LAB_0082cb90;
        }
        local_250.position_ = 0;
        bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                          (&local_238,1e+21,&local_250,SHORTEST);
        pcVar3 = local_250.buffer_.start_;
        if (bVar1) {
          local_250.buffer_.start_[local_250.position_] = '\0';
          local_250.position_ = -1;
          if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
          iVar2 = strcmp("1e+21",local_250.buffer_.start_);
          if (iVar2 != 0) {
            pcVar4 = "\"1e+21\"";
            pcVar6 = "1e+21";
            uVar5 = 0x3d;
            goto LAB_0082cb90;
          }
          local_250.position_ = 0;
          bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                            (&local_238,1e-23,&local_250,SHORTEST);
          pcVar3 = local_250.buffer_.start_;
          if (bVar1) {
            local_250.buffer_.start_[local_250.position_] = '\0';
            local_250.position_ = -1;
            if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
            iVar2 = strcmp("1e-23",local_250.buffer_.start_);
            if (iVar2 != 0) {
              pcVar4 = "\"1e-23\"";
              pcVar6 = "1e-23";
              uVar5 = 0x41;
              goto LAB_0082cb90;
            }
            local_250.position_ = 0;
            bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                              (&local_238,1e+20,&local_250,SHORTEST);
            pcVar3 = local_250.buffer_.start_;
            if (bVar1) {
              local_250.buffer_.start_[local_250.position_] = '\0';
              local_250.position_ = -1;
              if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
              iVar2 = strcmp("100000000000000000000",local_250.buffer_.start_);
              if (iVar2 != 0) {
                pcVar4 = "\"100000000000000000000\"";
                pcVar6 = "100000000000000000000";
                uVar5 = 0x45;
                goto LAB_0082cb90;
              }
              local_250.position_ = 0;
              bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                (&local_238,1.1111111111111111e+20,&local_250,SHORTEST);
              pcVar3 = local_250.buffer_.start_;
              if (bVar1) {
                local_250.buffer_.start_[local_250.position_] = '\0';
                local_250.position_ = -1;
                if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                iVar2 = strcmp("111111111111111110000",local_250.buffer_.start_);
                if (iVar2 != 0) {
                  pcVar4 = "\"111111111111111110000\"";
                  pcVar6 = "111111111111111110000";
                  uVar5 = 0x49;
                  goto LAB_0082cb90;
                }
                local_250.position_ = 0;
                bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                  (&local_238,1.1111111111111111e+21,&local_250,SHORTEST);
                pcVar3 = local_250.buffer_.start_;
                if (bVar1) {
                  local_250.buffer_.start_[local_250.position_] = '\0';
                  local_250.position_ = -1;
                  if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                  iVar2 = strcmp("1.1111111111111111e+21",local_250.buffer_.start_);
                  if (iVar2 != 0) {
                    pcVar4 = "\"1.1111111111111111e+21\"";
                    pcVar6 = "1.1111111111111111e+21";
                    uVar5 = 0x4d;
                    goto LAB_0082cb90;
                  }
                  local_250.position_ = 0;
                  bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                    (&local_238,1.1111111111111111e+22,&local_250,SHORTEST);
                  pcVar3 = local_250.buffer_.start_;
                  if (bVar1) {
                    local_250.buffer_.start_[local_250.position_] = '\0';
                    local_250.position_ = -1;
                    if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                    iVar2 = strcmp("1.1111111111111111e+22",local_250.buffer_.start_);
                    if (iVar2 != 0) {
                      pcVar4 = "\"1.1111111111111111e+22\"";
                      pcVar6 = "1.1111111111111111e+22";
                      uVar5 = 0x51;
                      goto LAB_0082cb90;
                    }
                    local_250.position_ = 0;
                    bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                      (&local_238,-1e-05,&local_250,SHORTEST);
                    pcVar3 = local_250.buffer_.start_;
                    if (bVar1) {
                      local_250.buffer_.start_[local_250.position_] = '\0';
                      local_250.position_ = -1;
                      if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                      iVar2 = strcmp("-0.00001",local_250.buffer_.start_);
                      if (iVar2 != 0) {
                        pcVar4 = "\"-0.00001\"";
                        pcVar6 = "-0.00001";
                        uVar5 = 0x55;
                        goto LAB_0082cb90;
                      }
                      local_250.position_ = 0;
                      bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                        (&local_238,-1e-06,&local_250,SHORTEST);
                      pcVar3 = local_250.buffer_.start_;
                      if (bVar1) {
                        local_250.buffer_.start_[local_250.position_] = '\0';
                        local_250.position_ = -1;
                        if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                        iVar2 = strcmp("-0.000001",local_250.buffer_.start_);
                        if (iVar2 != 0) {
                          pcVar4 = "\"-0.000001\"";
                          pcVar6 = "-0.000001";
                          uVar5 = 0x59;
                          goto LAB_0082cb90;
                        }
                        local_250.position_ = 0;
                        bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                          (&local_238,-1e-07,&local_250,SHORTEST);
                        pcVar3 = local_250.buffer_.start_;
                        if (bVar1) {
                          local_250.buffer_.start_[local_250.position_] = '\0';
                          local_250.position_ = -1;
                          if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                          iVar2 = strcmp("-1e-7",local_250.buffer_.start_);
                          if (iVar2 != 0) {
                            pcVar4 = "\"-1e-7\"";
                            pcVar6 = "-1e-7";
                            uVar5 = 0x5d;
                            goto LAB_0082cb90;
                          }
                          local_250.position_ = 0;
                          bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                            (&local_238,-0.0,&local_250,SHORTEST);
                          pcVar3 = local_250.buffer_.start_;
                          if (bVar1) {
                            local_250.buffer_.start_[local_250.position_] = '\0';
                            local_250.position_ = -1;
                            if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                            iVar2 = strcmp("0",local_250.buffer_.start_);
                            if (iVar2 != 0) {
                              pcVar4 = "\"0\"";
                              pcVar6 = "0";
                              uVar5 = 0x61;
                              goto LAB_0082cb90;
                            }
                            local_1a8.flags_ = 9;
                            local_1a8.infinity_symbol_ = (char *)0x0;
                            local_1a8.nan_symbol_ = (char *)0x0;
                            local_1a8.exponent_character_ = 'e';
                            local_1a8.decimal_in_shortest_low_ = -4;
                            local_1a8.decimal_in_shortest_high_ = 6;
                            local_1a8.max_leading_padding_zeroes_in_precision_mode_ = 0;
                            local_1a8.max_trailing_padding_zeroes_in_precision_mode_ = 0;
                            local_1a8.min_exponent_width_ = 2;
                            local_250.position_ = 0;
                            bVar1 = double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
                                              (&local_1a8,11111111111.0,&local_250,SHORTEST);
                            pcVar3 = local_250.buffer_.start_;
                            if (bVar1) {
                              local_250.buffer_.start_[local_250.position_] = '\0';
                              local_250.position_ = -1;
                              if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                              iVar2 = strcmp("1.1111111111e+10",local_250.buffer_.start_);
                              if (iVar2 != 0) {
                                pcVar4 = "\"1.1111111111e+10\"";
                                pcVar6 = "1.1111111111e+10";
                                uVar5 = 0x6a;
                                goto LAB_0082cb90;
                              }
                              local_250.position_ = 0;
                              bVar1 = double_conversion::DoubleToStringConverter::
                                      ToShortestIeeeNumber
                                                (&local_1a8,1111111111.0,&local_250,SHORTEST);
                              pcVar3 = local_250.buffer_.start_;
                              if (bVar1) {
                                local_250.buffer_.start_[local_250.position_] = '\0';
                                local_250.position_ = -1;
                                if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                                iVar2 = strcmp("1.111111111e+09",local_250.buffer_.start_);
                                if (iVar2 != 0) {
                                  pcVar4 = "\"1.111111111e+09\"";
                                  pcVar6 = "1.111111111e+09";
                                  uVar5 = 0x6e;
                                  goto LAB_0082cb90;
                                }
                                local_250.position_ = 0;
                                bVar1 = double_conversion::DoubleToStringConverter::
                                        ToShortestIeeeNumber
                                                  (&local_1a8,1111111.0,&local_250,SHORTEST);
                                pcVar3 = local_250.buffer_.start_;
                                if (bVar1) {
                                  local_250.buffer_.start_[local_250.position_] = '\0';
                                  local_250.position_ = -1;
                                  if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                                  iVar2 = strcmp("1.111111e+06",local_250.buffer_.start_);
                                  if (iVar2 != 0) {
                                    pcVar4 = "\"1.111111e+06\"";
                                    pcVar6 = "1.111111e+06";
                                    uVar5 = 0x72;
                                    goto LAB_0082cb90;
                                  }
                                  local_250.position_ = 0;
                                  bVar1 = double_conversion::DoubleToStringConverter::
                                          ToShortestIeeeNumber
                                                    (&local_1a8,111111.0,&local_250,SHORTEST);
                                  pcVar3 = local_250.buffer_.start_;
                                  if (bVar1) {
                                    local_250.buffer_.start_[local_250.position_] = '\0';
                                    local_250.position_ = -1;
                                    if (local_250.buffer_.start_ == (char *)0x0) goto LAB_0082bbc3;
                                    iVar2 = strcmp("111111",local_250.buffer_.start_);
                                    if (iVar2 != 0) {
                                      pcVar4 = "\"111111\"";
                                      pcVar6 = "111111";
                                      uVar5 = 0x76;
                                      goto LAB_0082cb90;
                                    }
                                    local_250.position_ = 0;
                                    bVar1 = double_conversion::DoubleToStringConverter::
                                            ToShortestIeeeNumber
                                                      (&local_1a8,10000000000.0,&local_250,SHORTEST)
                                    ;
                                    pcVar3 = local_250.buffer_.start_;
                                    if (bVar1) {
                                      local_250.buffer_.start_[local_250.position_] = '\0';
                                      local_250.position_ = -1;
                                      if (local_250.buffer_.start_ == (char *)0x0)
                                      goto LAB_0082bbc3;
                                      iVar2 = strcmp("1e+10",local_250.buffer_.start_);
                                      if (iVar2 != 0) {
                                        pcVar4 = "\"1e+10\"";
                                        pcVar6 = "1e+10";
                                        uVar5 = 0x7a;
                                        goto LAB_0082cb90;
                                      }
                                      local_250.position_ = 0;
                                      bVar1 = double_conversion::DoubleToStringConverter::
                                              ToShortestIeeeNumber
                                                        (&local_1a8,1000000000.0,&local_250,SHORTEST
                                                        );
                                      pcVar3 = local_250.buffer_.start_;
                                      if (bVar1) {
                                        local_250.buffer_.start_[local_250.position_] = '\0';
                                        local_250.position_ = -1;
                                        if (local_250.buffer_.start_ == (char *)0x0)
                                        goto LAB_0082bbc3;
                                        iVar2 = strcmp("1e+09",local_250.buffer_.start_);
                                        if (iVar2 != 0) {
                                          pcVar4 = "\"1e+09\"";
                                          pcVar6 = "1e+09";
                                          uVar5 = 0x7e;
                                          goto LAB_0082cb90;
                                        }
                                        local_1d8.flags_ = 9;
                                        local_1d8.infinity_symbol_ = (char *)0x0;
                                        local_1d8.nan_symbol_ = (char *)0x0;
                                        local_1d8.exponent_character_ = 'e';
                                        local_1d8.decimal_in_shortest_low_ = -4;
                                        local_1d8.decimal_in_shortest_high_ = 6;
                                        local_1d8.max_leading_padding_zeroes_in_precision_mode_ = 0;
                                        local_1d8.max_trailing_padding_zeroes_in_precision_mode_ = 0
                                        ;
                                        local_1d8.min_exponent_width_ = 0;
                                        local_250.position_ = 0;
                                        bVar1 = double_conversion::DoubleToStringConverter::
                                                ToShortestIeeeNumber
                                                          (&local_1d8,11111111111.0,&local_250,
                                                           SHORTEST);
                                        pcVar3 = local_250.buffer_.start_;
                                        if (bVar1) {
                                          local_250.buffer_.start_[local_250.position_] = '\0';
                                          local_250.position_ = -1;
                                          if (local_250.buffer_.start_ == (char *)0x0)
                                          goto LAB_0082bbc3;
                                          iVar2 = strcmp("1.1111111111e+10",local_250.buffer_.start_
                                                        );
                                          if (iVar2 != 0) {
                                            pcVar4 = "\"1.1111111111e+10\"";
                                            pcVar6 = "1.1111111111e+10";
                                            uVar5 = 0x84;
                                            goto LAB_0082cb90;
                                          }
                                          local_250.position_ = 0;
                                          bVar1 = double_conversion::DoubleToStringConverter::
                                                  ToShortestIeeeNumber
                                                            (&local_1d8,1111111111.0,&local_250,
                                                             SHORTEST);
                                          pcVar3 = local_250.buffer_.start_;
                                          if (bVar1) {
                                            local_250.buffer_.start_[local_250.position_] = '\0';
                                            local_250.position_ = -1;
                                            if (local_250.buffer_.start_ == (char *)0x0)
                                            goto LAB_0082bbc3;
                                            iVar2 = strcmp("1.111111111e+9",local_250.buffer_.start_
                                                          );
                                            if (iVar2 != 0) {
                                              pcVar4 = "\"1.111111111e+9\"";
                                              pcVar6 = "1.111111111e+9";
                                              uVar5 = 0x88;
                                              goto LAB_0082cb90;
                                            }
                                            local_250.position_ = 0;
                                            bVar1 = double_conversion::DoubleToStringConverter::
                                                    ToShortestIeeeNumber
                                                              (&local_1d8,1111111.0,&local_250,
                                                               SHORTEST);
                                            pcVar3 = local_250.buffer_.start_;
                                            if (bVar1) {
                                              local_250.buffer_.start_[local_250.position_] = '\0';
                                              local_250.position_ = -1;
                                              if (local_250.buffer_.start_ == (char *)0x0)
                                              goto LAB_0082bbc3;
                                              iVar2 = strcmp("1.111111e+6",local_250.buffer_.start_)
                                              ;
                                              if (iVar2 != 0) {
                                                pcVar4 = "\"1.111111e+6\"";
                                                pcVar6 = "1.111111e+6";
                                                uVar5 = 0x8c;
                                                goto LAB_0082cb90;
                                              }
                                              local_250.position_ = 0;
                                              bVar1 = double_conversion::DoubleToStringConverter::
                                                      ToShortestIeeeNumber
                                                                (&local_1d8,111111.0,&local_250,
                                                                 SHORTEST);
                                              pcVar3 = local_250.buffer_.start_;
                                              if (bVar1) {
                                                local_250.buffer_.start_[local_250.position_] = '\0'
                                                ;
                                                local_250.position_ = -1;
                                                if (local_250.buffer_.start_ == (char *)0x0)
                                                goto LAB_0082bbc3;
                                                iVar2 = strcmp("111111",local_250.buffer_.start_);
                                                if (iVar2 != 0) {
                                                  pcVar4 = "\"111111\"";
                                                  pcVar6 = "111111";
                                                  uVar5 = 0x90;
                                                  goto LAB_0082cb90;
                                                }
                                                local_250.position_ = 0;
                                                bVar1 = double_conversion::DoubleToStringConverter::
                                                        ToShortestIeeeNumber
                                                                  (&local_1d8,10000000000.0,
                                                                   &local_250,SHORTEST);
                                                pcVar3 = local_250.buffer_.start_;
                                                if (bVar1) {
                                                  local_250.buffer_.start_[local_250.position_] =
                                                       '\0';
                                                  local_250.position_ = -1;
                                                  if (local_250.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0082bbc3;
                                                  iVar2 = strcmp("1e+10",local_250.buffer_.start_);
                                                  if (iVar2 != 0) {
                                                    pcVar4 = "\"1e+10\"";
                                                    pcVar6 = "1e+10";
                                                    uVar5 = 0x94;
                                                    goto LAB_0082cb90;
                                                  }
                                                  local_250.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToShortestIeeeNumber
                                                                    (&local_1d8,1000000000.0,
                                                                     &local_250,SHORTEST);
                                                  pcVar3 = local_250.buffer_.start_;
                                                  if (bVar1) {
                                                    local_250.buffer_.start_[local_250.position_] =
                                                         '\0';
                                                    local_250.position_ = -1;
                                                    if (local_250.buffer_.start_ == (char *)0x0)
                                                    goto LAB_0082bbc3;
                                                    iVar2 = strcmp("1e+9",local_250.buffer_.start_);
                                                    if (iVar2 != 0) {
                                                      pcVar4 = "\"1e+9\"";
                                                      pcVar6 = "1e+9";
                                                      uVar5 = 0x98;
                                                      goto LAB_0082cb90;
                                                    }
                                                    local_208.flags_ = 9;
                                                    local_208.infinity_symbol_ = (char *)0x0;
                                                    local_208.nan_symbol_ = (char *)0x0;
                                                    local_208.exponent_character_ = 'e';
                                                    local_208.decimal_in_shortest_low_ = -4;
                                                    local_208.decimal_in_shortest_high_ = 6;
                                                    local_208.
                                                    max_leading_padding_zeroes_in_precision_mode_ =
                                                         0;
                                                    local_208.
                                                    max_trailing_padding_zeroes_in_precision_mode_ =
                                                         0;
                                                    local_208.min_exponent_width_ = 100;
                                                    local_250.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_208,11111111111.0,
                                                                       &local_250,SHORTEST);
                                                    pcVar3 = local_250.buffer_.start_;
                                                    if (bVar1) {
                                                      local_250.buffer_.start_[local_250.position_]
                                                           = '\0';
                                                      local_250.position_ = -1;
                                                      if (local_250.buffer_.start_ == (char *)0x0)
                                                      goto LAB_0082bbc3;
                                                      iVar2 = strcmp("1.1111111111e+00010",
                                                                     local_250.buffer_.start_);
                                                      if (iVar2 != 0) {
                                                        pcVar4 = "\"1.1111111111e+00010\"";
                                                        pcVar6 = "1.1111111111e+00010";
                                                        uVar5 = 0xa0;
                                                        goto LAB_0082cb90;
                                                      }
                                                      local_250.position_ = 0;
                                                      bVar1 = double_conversion::
                                                              DoubleToStringConverter::
                                                              ToShortestIeeeNumber
                                                                        (&local_208,1111111111.0,
                                                                         &local_250,SHORTEST);
                                                      pcVar3 = local_250.buffer_.start_;
                                                      if (bVar1) {
                                                        local_250.buffer_.start_
                                                        [local_250.position_] = '\0';
                                                        local_250.position_ = -1;
                                                        if (local_250.buffer_.start_ == (char *)0x0)
                                                        goto LAB_0082bbc3;
                                                        iVar2 = strcmp("1.111111111e+00009",
                                                                       local_250.buffer_.start_);
                                                        if (iVar2 != 0) {
                                                          pcVar4 = "\"1.111111111e+00009\"";
                                                          pcVar6 = "1.111111111e+00009";
                                                          uVar5 = 0xa4;
                                                          goto LAB_0082cb90;
                                                        }
                                                        local_250.position_ = 0;
                                                        bVar1 = double_conversion::
                                                                DoubleToStringConverter::
                                                                ToShortestIeeeNumber
                                                                          (&local_208,1111111.0,
                                                                           &local_250,SHORTEST);
                                                        pcVar3 = local_250.buffer_.start_;
                                                        if (bVar1) {
                                                          local_250.buffer_.start_
                                                          [local_250.position_] = '\0';
                                                          local_250.position_ = -1;
                                                          if (local_250.buffer_.start_ ==
                                                              (char *)0x0) goto LAB_0082bbc3;
                                                          iVar2 = strcmp("1.111111e+00006",
                                                                         local_250.buffer_.start_);
                                                          if (iVar2 != 0) {
                                                            pcVar4 = "\"1.111111e+00006\"";
                                                            pcVar6 = "1.111111e+00006";
                                                            uVar5 = 0xa8;
                                                            goto LAB_0082cb90;
                                                          }
                                                          local_250.position_ = 0;
                                                          bVar1 = double_conversion::
                                                                  DoubleToStringConverter::
                                                                  ToShortestIeeeNumber
                                                                            (&local_208,111111.0,
                                                                             &local_250,SHORTEST);
                                                          pcVar3 = local_250.buffer_.start_;
                                                          if (bVar1) {
                                                            local_250.buffer_.start_
                                                            [local_250.position_] = '\0';
                                                            local_250.position_ = -1;
                                                            if (local_250.buffer_.start_ ==
                                                                (char *)0x0) goto LAB_0082bbc3;
                                                            iVar2 = strcmp("111111",local_250.
                                                                                    buffer_.start_);
                                                            if (iVar2 != 0) {
                                                              pcVar4 = "\"111111\"";
                                                              pcVar6 = "111111";
                                                              uVar5 = 0xac;
                                                              goto LAB_0082cb90;
                                                            }
                                                            local_250.position_ = 0;
                                                            bVar1 = double_conversion::
                                                                    DoubleToStringConverter::
                                                                    ToShortestIeeeNumber
                                                                              (&local_208,
                                                                               10000000000.0,
                                                                               &local_250,SHORTEST);
                                                            pcVar3 = local_250.buffer_.start_;
                                                            if (bVar1) {
                                                              local_250.buffer_.start_
                                                              [local_250.position_] = '\0';
                                                              local_250.position_ = -1;
                                                              if (local_250.buffer_.start_ ==
                                                                  (char *)0x0) goto LAB_0082bbc3;
                                                              iVar2 = strcmp("1e+00010",
                                                                             local_250.buffer_.
                                                                             start_);
                                                              if (iVar2 != 0) {
                                                                pcVar4 = "\"1e+00010\"";
                                                                pcVar6 = "1e+00010";
                                                                uVar5 = 0xb0;
                                                                goto LAB_0082cb90;
                                                              }
                                                              local_250.position_ = 0;
                                                              bVar1 = double_conversion::
                                                                      DoubleToStringConverter::
                                                                      ToShortestIeeeNumber
                                                                                (&local_208,
                                                                                 1000000000.0,
                                                                                 &local_250,SHORTEST
                                                                                );
                                                              pcVar3 = local_250.buffer_.start_;
                                                              if (bVar1) {
                                                                local_250.buffer_.start_
                                                                [local_250.position_] = '\0';
                                                                local_250.position_ = -1;
                                                                if (local_250.buffer_.start_ ==
                                                                    (char *)0x0) goto LAB_0082bbc3;
                                                                iVar2 = strcmp("1e+00009",
                                                                               local_250.buffer_.
                                                                               start_);
                                                                if (iVar2 != 0) {
                                                                  pcVar4 = "\"1e+00009\"";
                                                                  pcVar6 = "1e+00009";
                                                                  uVar5 = 0xb4;
                                                                  goto LAB_0082cb90;
                                                                }
                                                                local_148.flags_ = 0;
                                                                local_148.infinity_symbol_ =
                                                                     (char *)0x0;
                                                                local_148.nan_symbol_ = (char *)0x0;
                                                                local_148.exponent_character_ = 'e';
                                                                local_148.decimal_in_shortest_low_ =
                                                                     -1;
                                                                local_148.decimal_in_shortest_high_
                                                                     = 1;
                                                                local_148.
                                                                                                                                
                                                  max_leading_padding_zeroes_in_precision_mode_ = 0;
                                                  local_148.
                                                  max_trailing_padding_zeroes_in_precision_mode_ = 0
                                                  ;
                                                  local_148.min_exponent_width_ = 0;
                                                  local_250.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToShortestIeeeNumber
                                                                    (&local_148,0.1,&local_250,
                                                                     SHORTEST);
                                                  pcVar3 = local_250.buffer_.start_;
                                                  if (bVar1) {
                                                    local_250.buffer_.start_[local_250.position_] =
                                                         '\0';
                                                    local_250.position_ = -1;
                                                    if (local_250.buffer_.start_ == (char *)0x0)
                                                    goto LAB_0082bbc3;
                                                    iVar2 = strcmp("0.1",local_250.buffer_.start_);
                                                    if (iVar2 != 0) {
                                                      pcVar4 = "\"0.1\"";
                                                      pcVar6 = "0.1";
                                                      uVar5 = 0xbb;
                                                      goto LAB_0082cb90;
                                                    }
                                                    local_250.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_148,0.01,&local_250,
                                                                       SHORTEST);
                                                    pcVar3 = local_250.buffer_.start_;
                                                    if (bVar1) {
                                                      local_250.buffer_.start_[local_250.position_]
                                                           = '\0';
                                                      local_250.position_ = -1;
                                                      if (local_250.buffer_.start_ == (char *)0x0)
                                                      goto LAB_0082bbc3;
                                                      iVar2 = strcmp("1e-2",local_250.buffer_.start_
                                                                    );
                                                      if (iVar2 != 0) {
                                                        pcVar4 = "\"1e-2\"";
                                                        pcVar6 = "1e-2";
                                                        uVar5 = 0xbf;
                                                        goto LAB_0082cb90;
                                                      }
                                                      local_250.position_ = 0;
                                                      bVar1 = double_conversion::
                                                              DoubleToStringConverter::
                                                              ToShortestIeeeNumber
                                                                        (&local_148,1.0,&local_250,
                                                                         SHORTEST);
                                                      pcVar3 = local_250.buffer_.start_;
                                                      if (bVar1) {
                                                        local_250.buffer_.start_
                                                        [local_250.position_] = '\0';
                                                        local_250.position_ = -1;
                                                        if (local_250.buffer_.start_ == (char *)0x0)
                                                        goto LAB_0082bbc3;
                                                        iVar2 = strcmp("1",local_250.buffer_.start_)
                                                        ;
                                                        if (iVar2 != 0) {
                                                          pcVar4 = "\"1\"";
                                                          pcVar6 = "1";
                                                          uVar5 = 0xc3;
                                                          goto LAB_0082cb90;
                                                        }
                                                        local_250.position_ = 0;
                                                        bVar1 = double_conversion::
                                                                DoubleToStringConverter::
                                                                ToShortestIeeeNumber
                                                                          (&local_148,10.0,
                                                                           &local_250,SHORTEST);
                                                        pcVar3 = local_250.buffer_.start_;
                                                        if (bVar1) {
                                                          local_250.buffer_.start_
                                                          [local_250.position_] = '\0';
                                                          local_250.position_ = -1;
                                                          if (local_250.buffer_.start_ ==
                                                              (char *)0x0) goto LAB_0082bbc3;
                                                          iVar2 = strcmp("1e1",local_250.buffer_.
                                                                               start_);
                                                          if (iVar2 != 0) {
                                                            pcVar4 = "\"1e1\"";
                                                            pcVar6 = "1e1";
                                                            uVar5 = 199;
                                                            goto LAB_0082cb90;
                                                          }
                                                          local_250.position_ = 0;
                                                          bVar1 = double_conversion::
                                                                  DoubleToStringConverter::
                                                                  ToShortestIeeeNumber
                                                                            (&local_148,-0.0,
                                                                             &local_250,SHORTEST);
                                                          pcVar3 = local_250.buffer_.start_;
                                                          if (bVar1) {
                                                            local_250.buffer_.start_
                                                            [local_250.position_] = '\0';
                                                            local_250.position_ = -1;
                                                            if (local_250.buffer_.start_ ==
                                                                (char *)0x0) goto LAB_0082bbc3;
                                                            iVar2 = strcmp("-0",local_250.buffer_.
                                                                                start_);
                                                            if (iVar2 != 0) {
                                                              pcVar4 = "\"-0\"";
                                                              pcVar6 = "-0";
                                                              uVar5 = 0xcb;
                                                              goto LAB_0082cb90;
                                                            }
                                                            local_b8.flags_ = 6;
                                                            local_b8.infinity_symbol_ = (char *)0x0;
                                                            local_b8.nan_symbol_ = (char *)0x0;
                                                            local_b8.exponent_character_ = 'E';
                                                            local_b8.decimal_in_shortest_low_ = -5;
                                                            local_b8.decimal_in_shortest_high_ = 5;
                                                            local_b8.
                                                  max_leading_padding_zeroes_in_precision_mode_ = 0;
                                                  local_b8.
                                                  max_trailing_padding_zeroes_in_precision_mode_ = 0
                                                  ;
                                                  local_b8.min_exponent_width_ = 0;
                                                  local_250.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToShortestIeeeNumber
                                                                    (&local_b8,0.1,&local_250,
                                                                     SHORTEST);
                                                  pcVar3 = local_250.buffer_.start_;
                                                  if (bVar1) {
                                                    local_250.buffer_.start_[local_250.position_] =
                                                         '\0';
                                                    local_250.position_ = -1;
                                                    if (local_250.buffer_.start_ == (char *)0x0)
                                                    goto LAB_0082bbc3;
                                                    iVar2 = strcmp("0.1",local_250.buffer_.start_);
                                                    if (iVar2 != 0) {
                                                      pcVar4 = "\"0.1\"";
                                                      pcVar6 = "0.1";
                                                      uVar5 = 0xd3;
                                                      goto LAB_0082cb90;
                                                    }
                                                    local_250.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_b8,1.0,&local_250,
                                                                       SHORTEST);
                                                    pcVar3 = local_250.buffer_.start_;
                                                    if (bVar1) {
                                                      local_250.buffer_.start_[local_250.position_]
                                                           = '\0';
                                                      local_250.position_ = -1;
                                                      if (local_250.buffer_.start_ == (char *)0x0)
                                                      goto LAB_0082bbc3;
                                                      iVar2 = strcmp("1.0",local_250.buffer_.start_)
                                                      ;
                                                      if (iVar2 != 0) {
                                                        pcVar4 = "\"1.0\"";
                                                        pcVar6 = "1.0";
                                                        uVar5 = 0xd7;
                                                        goto LAB_0082cb90;
                                                      }
                                                      local_250.position_ = 0;
                                                      bVar1 = double_conversion::
                                                              DoubleToStringConverter::
                                                              ToShortestIeeeNumber
                                                                        (&local_b8,10000.0,
                                                                         &local_250,SHORTEST);
                                                      pcVar3 = local_250.buffer_.start_;
                                                      if (bVar1) {
                                                        local_250.buffer_.start_
                                                        [local_250.position_] = '\0';
                                                        local_250.position_ = -1;
                                                        if (local_250.buffer_.start_ == (char *)0x0)
                                                        goto LAB_0082bbc3;
                                                        iVar2 = strcmp("10000.0",
                                                                       local_250.buffer_.start_);
                                                        if (iVar2 != 0) {
                                                          pcVar4 = "\"10000.0\"";
                                                          pcVar6 = "10000.0";
                                                          uVar5 = 0xdb;
                                                          goto LAB_0082cb90;
                                                        }
                                                        local_250.position_ = 0;
                                                        bVar1 = double_conversion::
                                                                DoubleToStringConverter::
                                                                ToShortestIeeeNumber
                                                                          (&local_b8,100000.0,
                                                                           &local_250,SHORTEST);
                                                        pcVar3 = local_250.buffer_.start_;
                                                        if (bVar1) {
                                                          local_250.buffer_.start_
                                                          [local_250.position_] = '\0';
                                                          local_250.position_ = -1;
                                                          if (local_250.buffer_.start_ ==
                                                              (char *)0x0) goto LAB_0082bbc3;
                                                          iVar2 = strcmp("1E5",local_250.buffer_.
                                                                               start_);
                                                          if (iVar2 != 0) {
                                                            pcVar4 = "\"1E5\"";
                                                            pcVar6 = "1E5";
                                                            uVar5 = 0xdf;
                                                            goto LAB_0082cb90;
                                                          }
                                                          local_178.flags_ = 1;
                                                          local_178.infinity_symbol_ = (char *)0x0;
                                                          local_178.nan_symbol_ = (char *)0x0;
                                                          local_178.exponent_character_ = 'e';
                                                          local_178.decimal_in_shortest_low_ = -6;
                                                          local_178.decimal_in_shortest_high_ = 0x15
                                                          ;
                                                          local_178.
                                                                                                                    
                                                  max_leading_padding_zeroes_in_precision_mode_ = 0;
                                                  local_178.
                                                  max_trailing_padding_zeroes_in_precision_mode_ = 0
                                                  ;
                                                  local_178.min_exponent_width_ = 0;
                                                  local_250.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToShortestIeeeNumber
                                                                    (&local_178,1e-06,&local_250,
                                                                     SHORTEST);
                                                  pcVar3 = local_250.buffer_.start_;
                                                  if (bVar1) {
                                                    local_250.buffer_.start_[local_250.position_] =
                                                         '\0';
                                                    local_250.position_ = -1;
                                                    if (local_250.buffer_.start_ == (char *)0x0)
                                                    goto LAB_0082bbc3;
                                                    iVar2 = strcmp("0.000001",
                                                                   local_250.buffer_.start_);
                                                    if (iVar2 != 0) {
                                                      pcVar4 = "\"0.000001\"";
                                                      pcVar6 = "0.000001";
                                                      uVar5 = 0xe7;
                                                      goto LAB_0082cb90;
                                                    }
                                                    local_250.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_178,1e-07,&local_250,
                                                                       SHORTEST);
                                                    pcVar3 = local_250.buffer_.start_;
                                                    if (bVar1) {
                                                      local_250.buffer_.start_[local_250.position_]
                                                           = '\0';
                                                      local_250.position_ = -1;
                                                      if (local_250.buffer_.start_ == (char *)0x0)
                                                      goto LAB_0082bbc3;
                                                      iVar2 = strcmp("1e-7",local_250.buffer_.start_
                                                                    );
                                                      if (iVar2 != 0) {
                                                        pcVar4 = "\"1e-7\"";
                                                        pcVar6 = "1e-7";
                                                        uVar5 = 0xeb;
                                                        goto LAB_0082cb90;
                                                      }
                                                      local_250.position_ = 0;
                                                      bVar1 = double_conversion::
                                                              DoubleToStringConverter::
                                                              ToShortestIeeeNumber
                                                                        (&local_178,
                                                                         1.1111111111111111e+20,
                                                                         &local_250,SHORTEST);
                                                      pcVar3 = local_250.buffer_.start_;
                                                      if (bVar1) {
                                                        local_250.buffer_.start_
                                                        [local_250.position_] = '\0';
                                                        local_250.position_ = -1;
                                                        if (local_250.buffer_.start_ == (char *)0x0)
                                                        goto LAB_0082bbc3;
                                                        iVar2 = strcmp("111111111111111110000",
                                                                       local_250.buffer_.start_);
                                                        if (iVar2 != 0) {
                                                          pcVar4 = "\"111111111111111110000\"";
                                                          pcVar6 = "111111111111111110000";
                                                          uVar5 = 0xef;
                                                          goto LAB_0082cb90;
                                                        }
                                                        local_250.position_ = 0;
                                                        bVar1 = double_conversion::
                                                                DoubleToStringConverter::
                                                                ToShortestIeeeNumber
                                                                          (&local_178,1e+20,
                                                                           &local_250,SHORTEST);
                                                        pcVar3 = local_250.buffer_.start_;
                                                        if (bVar1) {
                                                          local_250.buffer_.start_
                                                          [local_250.position_] = '\0';
                                                          local_250.position_ = -1;
                                                          if (local_250.buffer_.start_ ==
                                                              (char *)0x0) goto LAB_0082bbc3;
                                                          iVar2 = strcmp("100000000000000000000",
                                                                         local_250.buffer_.start_);
                                                          if (iVar2 != 0) {
                                                            pcVar4 = "\"100000000000000000000\"";
                                                            pcVar6 = "100000000000000000000";
                                                            uVar5 = 0xf3;
                                                            goto LAB_0082cb90;
                                                          }
                                                          local_250.position_ = 0;
                                                          bVar1 = double_conversion::
                                                                  DoubleToStringConverter::
                                                                  ToShortestIeeeNumber
                                                                            (&local_178,
                                                                             1.1111111111111111e+21,
                                                                             &local_250,SHORTEST);
                                                          pcVar3 = local_250.buffer_.start_;
                                                          if (bVar1) {
                                                            local_250.buffer_.start_
                                                            [local_250.position_] = '\0';
                                                            local_250.position_ = -1;
                                                            if (local_250.buffer_.start_ ==
                                                                (char *)0x0) goto LAB_0082bbc3;
                                                            iVar2 = strcmp("1.1111111111111111e+21",
                                                                           local_250.buffer_.start_)
                                                            ;
                                                            if (iVar2 != 0) {
                                                              pcVar4 = "\"1.1111111111111111e+21\"";
                                                              pcVar6 = "1.1111111111111111e+21";
                                                              uVar5 = 0xf7;
                                                              goto LAB_0082cb90;
                                                            }
                                                            local_e8.flags_ = 1;
                                                            local_e8.infinity_symbol_ = (char *)0x0;
                                                            local_e8.nan_symbol_ = (char *)0x0;
                                                            local_e8.exponent_character_ = 'e';
                                                            local_e8.decimal_in_shortest_low_ = 0;
                                                            local_e8.decimal_in_shortest_high_ = 0;
                                                            local_e8.
                                                  max_leading_padding_zeroes_in_precision_mode_ = 0;
                                                  local_e8.
                                                  max_trailing_padding_zeroes_in_precision_mode_ = 0
                                                  ;
                                                  local_e8.min_exponent_width_ = 0;
                                                  local_250.position_ = 0;
                                                  bVar1 = double_conversion::DoubleToStringConverter
                                                          ::ToShortestIeeeNumber
                                                                    (&local_e8,INFINITY,&local_250,
                                                                     SHORTEST);
                                                  if (bVar1) {
                                                    pcVar3 = 
                                                  "!dc5.ToShortest(Double::Infinity(), &builder)";
                                                  uVar5 = 0xfd;
                                                  }
                                                  else {
                                                    local_250.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_e8,-INFINITY,
                                                                       &local_250,SHORTEST);
                                                    if (bVar1) {
                                                      pcVar3 = 
                                                  "!dc5.ToShortest(-Double::Infinity(), &builder)";
                                                  uVar5 = 0x100;
                                                  }
                                                  else {
                                                    local_250.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_e8,NAN,&local_250,
                                                                       SHORTEST);
                                                    if (bVar1) {
                                                      pcVar3 = 
                                                  "!dc5.ToShortest(Double::NaN(), &builder)";
                                                  uVar5 = 0x103;
                                                  }
                                                  else {
                                                    local_250.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_e8,-NAN,&local_250,
                                                                       SHORTEST);
                                                    if (bVar1) {
                                                      pcVar3 = 
                                                  "!dc5.ToShortest(-Double::NaN(), &builder)";
                                                  uVar5 = 0x106;
                                                  }
                                                  else {
                                                    local_118.flags_ = 1;
                                                    local_118.infinity_symbol_ = "Infinity";
                                                    local_118.nan_symbol_ = "NaN";
                                                    local_118.exponent_character_ = 'e';
                                                    local_118.decimal_in_shortest_low_ = 0;
                                                    local_118.decimal_in_shortest_high_ = 0;
                                                    local_118.
                                                    max_leading_padding_zeroes_in_precision_mode_ =
                                                         0;
                                                    local_118.
                                                    max_trailing_padding_zeroes_in_precision_mode_ =
                                                         0;
                                                    local_118.min_exponent_width_ = 0;
                                                    local_250.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_118,INFINITY,
                                                                       &local_250,SHORTEST);
                                                    pcVar3 = local_250.buffer_.start_;
                                                    if (bVar1) {
                                                      local_250.buffer_.start_[local_250.position_]
                                                           = '\0';
                                                      local_250.position_ = -1;
                                                      if (local_250.buffer_.start_ == (char *)0x0)
                                                      goto LAB_0082bbc3;
                                                      iVar2 = strcmp("Infinity",
                                                                     local_250.buffer_.start_);
                                                      if (iVar2 == 0) {
                                                        local_250.position_ = 0;
                                                        bVar1 = double_conversion::
                                                                DoubleToStringConverter::
                                                                ToShortestIeeeNumber
                                                                          (&local_118,-INFINITY,
                                                                           &local_250,SHORTEST);
                                                        pcVar3 = local_250.buffer_.start_;
                                                        if (!bVar1) {
                                                          pcVar3 = 
                                                  "dc6.ToShortest(-Double::Infinity(), &builder)";
                                                  uVar5 = 0x10f;
                                                  goto LAB_0082cb58;
                                                  }
                                                  local_250.buffer_.start_[local_250.position_] =
                                                       '\0';
                                                  local_250.position_ = -1;
                                                  if (local_250.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0082bbc3;
                                                  iVar2 = strcmp("-Infinity",
                                                                 local_250.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    local_250.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_118,NAN,&local_250,
                                                                       SHORTEST);
                                                    pcVar3 = local_250.buffer_.start_;
                                                    if (!bVar1) {
                                                      pcVar3 = 
                                                  "dc6.ToShortest(Double::NaN(), &builder)";
                                                  uVar5 = 0x113;
                                                  goto LAB_0082cb58;
                                                  }
                                                  local_250.buffer_.start_[local_250.position_] =
                                                       '\0';
                                                  local_250.position_ = -1;
                                                  if (local_250.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0082bbc3;
                                                  iVar2 = strcmp("NaN",local_250.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    local_250.position_ = 0;
                                                    bVar1 = double_conversion::
                                                            DoubleToStringConverter::
                                                            ToShortestIeeeNumber
                                                                      (&local_118,-NAN,&local_250,
                                                                       SHORTEST);
                                                    pcVar3 = local_250.buffer_.start_;
                                                    if (!bVar1) {
                                                      pcVar3 = 
                                                  "dc6.ToShortest(-Double::NaN(), &builder)";
                                                  uVar5 = 0x117;
                                                  goto LAB_0082cb58;
                                                  }
                                                  local_250.buffer_.start_[local_250.position_] =
                                                       '\0';
                                                  local_250.position_ = -1;
                                                  if (local_250.buffer_.start_ == (char *)0x0)
                                                  goto LAB_0082bbc3;
                                                  iVar2 = strcmp("NaN",local_250.buffer_.start_);
                                                  if (iVar2 == 0) {
                                                    return;
                                                  }
                                                  pcVar4 = "\"NaN\"";
                                                  pcVar6 = "NaN";
                                                  uVar5 = 0x118;
                                                  }
                                                  else {
                                                    pcVar4 = "\"NaN\"";
                                                    pcVar6 = "NaN";
                                                    uVar5 = 0x114;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "\"-Infinity\"";
                                                    pcVar6 = "-Infinity";
                                                    uVar5 = 0x110;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "\"Infinity\"";
                                                    pcVar6 = "Infinity";
                                                    uVar5 = 0x10c;
                                                  }
                                                  goto LAB_0082cb90;
                                                  }
                                                  pcVar3 = 
                                                  "dc6.ToShortest(Double::Infinity(), &builder)";
                                                  uVar5 = 0x10b;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dc4.ToShortest(1111111111111111111111.0, &builder)"
                                                  ;
                                                  uVar5 = 0xf6;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dc4.ToShortest(100000000000000000000.0, &builder)"
                                                  ;
                                                  uVar5 = 0xf2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dc4.ToShortest(111111111111111111111.0, &builder)"
                                                  ;
                                                  uVar5 = 0xee;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc4.ToShortest(0.0000001, &builder)";
                                                    uVar5 = 0xea;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc4.ToShortest(0.000001, &builder)";
                                                    uVar5 = 0xe6;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc3.ToShortest(100000.0, &builder)";
                                                    uVar5 = 0xde;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc3.ToShortest(10000.0, &builder)";
                                                    uVar5 = 0xda;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc3.ToShortest(1.0, &builder)";
                                                    uVar5 = 0xd6;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc3.ToShortest(0.1, &builder)";
                                                    uVar5 = 0xd2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc2.ToShortest(-0.0, &builder)";
                                                    uVar5 = 0xca;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc2.ToShortest(10.0, &builder)";
                                                    uVar5 = 0xc6;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc2.ToShortest(1.0, &builder)";
                                                    uVar5 = 0xc2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc2.ToShortest(0.01, &builder)";
                                                    uVar5 = 0xbe;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "dc2.ToShortest(0.1, &builder)";
                                                    uVar5 = 0xba;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dcExpWidth100.ToShortest(1000000000.0, &builder)"
                                                  ;
                                                  uVar5 = 0xb3;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dcExpWidth100.ToShortest(10000000000.0, &builder)"
                                                  ;
                                                  uVar5 = 0xaf;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dcExpWidth100.ToShortest(111111.0, &builder)";
                                                  uVar5 = 0xab;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dcExpWidth100.ToShortest(1111111.0, &builder)";
                                                  uVar5 = 0xa7;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dcExpWidth100.ToShortest(1111111111.0, &builder)"
                                                  ;
                                                  uVar5 = 0xa3;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dcExpWidth100.ToShortest(11111111111.0, &builder)"
                                                  ;
                                                  uVar5 = 0x9f;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "dcExpWidth0.ToShortest(1000000000.0, &builder)";
                                                  uVar5 = 0x97;
                                                  }
                                                }
                                                else {
                                                  pcVar3 = 
                                                  "dcExpWidth0.ToShortest(10000000000.0, &builder)";
                                                  uVar5 = 0x93;
                                                }
                                              }
                                              else {
                                                pcVar3 = 
                                                "dcExpWidth0.ToShortest(111111.0, &builder)";
                                                uVar5 = 0x8f;
                                              }
                                            }
                                            else {
                                              pcVar3 = "dcExpWidth0.ToShortest(1111111.0, &builder)"
                                              ;
                                              uVar5 = 0x8b;
                                            }
                                          }
                                          else {
                                            pcVar3 = 
                                            "dcExpWidth0.ToShortest(1111111111.0, &builder)";
                                            uVar5 = 0x87;
                                          }
                                        }
                                        else {
                                          pcVar3 = "dcExpWidth0.ToShortest(11111111111.0, &builder)"
                                          ;
                                          uVar5 = 0x83;
                                        }
                                      }
                                      else {
                                        pcVar3 = "dcExpWidth2.ToShortest(1000000000.0, &builder)";
                                        uVar5 = 0x7d;
                                      }
                                    }
                                    else {
                                      pcVar3 = "dcExpWidth2.ToShortest(10000000000.0, &builder)";
                                      uVar5 = 0x79;
                                    }
                                  }
                                  else {
                                    pcVar3 = "dcExpWidth2.ToShortest(111111.0, &builder)";
                                    uVar5 = 0x75;
                                  }
                                }
                                else {
                                  pcVar3 = "dcExpWidth2.ToShortest(1111111.0, &builder)";
                                  uVar5 = 0x71;
                                }
                              }
                              else {
                                pcVar3 = "dcExpWidth2.ToShortest(1111111111.0, &builder)";
                                uVar5 = 0x6d;
                              }
                            }
                            else {
                              pcVar3 = "dcExpWidth2.ToShortest(11111111111.0, &builder)";
                              uVar5 = 0x69;
                            }
                          }
                          else {
                            pcVar3 = "dc.ToShortest(-0.0, &builder)";
                            uVar5 = 0x60;
                          }
                        }
                        else {
                          pcVar3 = "dc.ToShortest(-0.0000001, &builder)";
                          uVar5 = 0x5c;
                        }
                      }
                      else {
                        pcVar3 = "dc.ToShortest(-0.000001, &builder)";
                        uVar5 = 0x58;
                      }
                    }
                    else {
                      pcVar3 = "dc.ToShortest(-0.00001, &builder)";
                      uVar5 = 0x54;
                    }
                  }
                  else {
                    pcVar3 = "dc.ToShortest(11111111111111111111111.0, &builder)";
                    uVar5 = 0x50;
                  }
                }
                else {
                  pcVar3 = "dc.ToShortest(1111111111111111111111.0, &builder)";
                  uVar5 = 0x4c;
                }
              }
              else {
                pcVar3 = "dc.ToShortest(111111111111111111111.0, &builder)";
                uVar5 = 0x48;
              }
            }
            else {
              pcVar3 = "dc.ToShortest(1e20, &builder)";
              uVar5 = 0x44;
            }
          }
          else {
            pcVar3 = "dc.ToShortest(1e-23, &builder)";
            uVar5 = 0x40;
          }
        }
        else {
          pcVar3 = "dc.ToShortest(1e21, &builder)";
          uVar5 = 0x3c;
        }
      }
      else {
        pcVar3 = "dc.ToShortest(12345e23, &builder)";
        uVar5 = 0x38;
      }
    }
    else {
      pcVar3 = "dc.ToShortest(12345.0, &builder)";
      uVar5 = 0x34;
    }
  }
  else {
    pcVar3 = "dc.ToShortest(0.0, &builder)";
    uVar5 = 0x30;
  }
LAB_0082cb58:
  printf("%s:%d:\n CHECK(%s) failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,uVar5,pcVar3);
  abort();
}

Assistant:

TEST(DoubleToShortest) {
  const int kBufferSize = 128;
  char buffer[kBufferSize];
  StringBuilder builder(buffer, kBufferSize);
  int flags = DoubleToStringConverter::UNIQUE_ZERO |
      DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc(flags, NULL, NULL, 'e', -6, 21, 0, 0);

  CHECK(dc.ToShortest(0.0, &builder));
  CHECK_EQ("0", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(12345.0, &builder));
  CHECK_EQ("12345", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(12345e23, &builder));
  CHECK_EQ("1.2345e+27", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1e21, &builder));
  CHECK_EQ("1e+21", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1e-23, &builder));
  CHECK_EQ("1e-23", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1e20, &builder));
  CHECK_EQ("100000000000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(111111111111111111111.0, &builder));
  CHECK_EQ("111111111111111110000", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(1111111111111111111111.0, &builder));
  CHECK_EQ("1.1111111111111111e+21", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(11111111111111111111111.0, &builder));
  CHECK_EQ("1.1111111111111111e+22", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.00001, &builder));
  CHECK_EQ("-0.00001", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.000001, &builder));
  CHECK_EQ("-0.000001", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.0000001, &builder));
  CHECK_EQ("-1e-7", builder.Finalize());

  builder.Reset();
  CHECK(dc.ToShortest(-0.0, &builder));
  CHECK_EQ("0", builder.Finalize());

  // Test min_exponent_width
  flags = DoubleToStringConverter::UNIQUE_ZERO |
      DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dcExpWidth2(flags, NULL, NULL, 'e', -4, 6, 0, 0, 2);

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(11111111111.0, &builder));
  CHECK_EQ("1.1111111111e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(1111111111.0, &builder));
  CHECK_EQ("1.111111111e+09", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(1111111.0, &builder));
  CHECK_EQ("1.111111e+06", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(111111.0, &builder));
  CHECK_EQ("111111", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(10000000000.0, &builder));
  CHECK_EQ("1e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth2.ToShortest(1000000000.0, &builder));
  CHECK_EQ("1e+09", builder.Finalize());

  DoubleToStringConverter dcExpWidth0(flags, NULL, NULL, 'e', -4, 6, 0, 0, 0);

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(11111111111.0, &builder));
  CHECK_EQ("1.1111111111e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(1111111111.0, &builder));
  CHECK_EQ("1.111111111e+9", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(1111111.0, &builder));
  CHECK_EQ("1.111111e+6", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(111111.0, &builder));
  CHECK_EQ("111111", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(10000000000.0, &builder));
  CHECK_EQ("1e+10", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth0.ToShortest(1000000000.0, &builder));
  CHECK_EQ("1e+9", builder.Finalize());

  // Set min_exponent_width to 100 is equal to 5,
  // as kMaxExponentLength is defined to 5 in double-to-string.cc
  DoubleToStringConverter dcExpWidth100(flags, NULL, NULL, 'e', -4, 6, 0, 0, 100);

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(11111111111.0, &builder));
  CHECK_EQ("1.1111111111e+00010", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(1111111111.0, &builder));
  CHECK_EQ("1.111111111e+00009", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(1111111.0, &builder));
  CHECK_EQ("1.111111e+00006", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(111111.0, &builder));
  CHECK_EQ("111111", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(10000000000.0, &builder));
  CHECK_EQ("1e+00010", builder.Finalize());

  builder.Reset();
  CHECK(dcExpWidth100.ToShortest(1000000000.0, &builder));
  CHECK_EQ("1e+00009", builder.Finalize());
  // End of min_exponent_width testing

  flags = DoubleToStringConverter::NO_FLAGS;
  DoubleToStringConverter dc2(flags, NULL, NULL, 'e', -1, 1, 0, 0);
  builder.Reset();
  CHECK(dc2.ToShortest(0.1, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(0.01, &builder));
  CHECK_EQ("1e-2", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(1.0, &builder));
  CHECK_EQ("1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(10.0, &builder));
  CHECK_EQ("1e1", builder.Finalize());

  builder.Reset();
  CHECK(dc2.ToShortest(-0.0, &builder));
  CHECK_EQ("-0", builder.Finalize());

  flags = DoubleToStringConverter::EMIT_TRAILING_DECIMAL_POINT |
      DoubleToStringConverter::EMIT_TRAILING_ZERO_AFTER_POINT;
  DoubleToStringConverter dc3(flags, NULL, NULL, 'E', -5, 5, 0, 0);

  builder.Reset();
  CHECK(dc3.ToShortest(0.1, &builder));
  CHECK_EQ("0.1", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortest(1.0, &builder));
  CHECK_EQ("1.0", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortest(10000.0, &builder));
  CHECK_EQ("10000.0", builder.Finalize());

  builder.Reset();
  CHECK(dc3.ToShortest(100000.0, &builder));
  CHECK_EQ("1E5", builder.Finalize());

  // Test the examples in the comments of ToShortest.
  flags = DoubleToStringConverter::EMIT_POSITIVE_EXPONENT_SIGN;
  DoubleToStringConverter dc4(flags, NULL, NULL, 'e', -6, 21, 0, 0);

  builder.Reset();
  CHECK(dc4.ToShortest(0.000001, &builder));
  CHECK_EQ("0.000001", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(0.0000001, &builder));
  CHECK_EQ("1e-7", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(111111111111111111111.0, &builder));
  CHECK_EQ("111111111111111110000", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(100000000000000000000.0, &builder));
  CHECK_EQ("100000000000000000000", builder.Finalize());

  builder.Reset();
  CHECK(dc4.ToShortest(1111111111111111111111.0, &builder));
  CHECK_EQ("1.1111111111111111e+21", builder.Finalize());

  // Test special value handling.
  DoubleToStringConverter dc5(flags, NULL, NULL, 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(!dc5.ToShortest(Double::Infinity(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortest(-Double::Infinity(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortest(Double::NaN(), &builder));

  builder.Reset();
  CHECK(!dc5.ToShortest(-Double::NaN(), &builder));

  DoubleToStringConverter dc6(flags, "Infinity", "NaN", 'e', 0, 0, 0, 0);

  builder.Reset();
  CHECK(dc6.ToShortest(Double::Infinity(), &builder));
  CHECK_EQ("Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortest(-Double::Infinity(), &builder));
  CHECK_EQ("-Infinity", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortest(Double::NaN(), &builder));
  CHECK_EQ("NaN", builder.Finalize());

  builder.Reset();
  CHECK(dc6.ToShortest(-Double::NaN(), &builder));
  CHECK_EQ("NaN", builder.Finalize());
}